

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall ParserData::~ParserData(ParserData *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  
  ppFVar1 = (this->functions).super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (this->functions).
                 super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar2 != ppFVar1; ppFVar2 = ppFVar2 + 1) {
    if (*ppFVar2 != (FunctionNode *)0x0) {
      (*((*ppFVar2)->super_Node)._vptr_Node[1])();
    }
  }
  std::_Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>::~_Vector_base
            (&(this->functions).super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>)
  ;
  std::__cxx11::string::~string((string *)&this->fn);
  return;
}

Assistant:

~ParserData() {
    for (FunctionNode* f : functions)
      delete f;
  }